

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::ImportTriangles(XmlSerializer *this,aiMesh *mesh)

{
  pointer __first;
  pointer __last;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  ulong *puVar5;
  aiFace *__result;
  aiFace *paVar6;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  string nodeName;
  vector<aiFace,_std::allocator<aiFace>_> local_78;
  undefined1 local_60 [48];
  
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_start = (aiFace *)0x0;
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiFace *)0x0;
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = ReadToEndElement(this,(string *)XmlTag::triangles_abi_cxx11_);
    __last = local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __first = local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (!bVar1) break;
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string
              ((string *)(local_60 + 0x10),(char *)CONCAT44(extraout_var,iVar2),
               (allocator *)local_60);
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar1 = std::operator==((char *)CONCAT44(extraout_var_00,iVar2),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::triangle_abi_cxx11_);
    if (bVar1) {
      ReadTriangle((XmlSerializer *)local_60);
      std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                (&local_78,(aiFace *)local_60);
      aiFace::~aiFace((aiFace *)local_60);
      iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::p1_abi_cxx11_);
      if ((char *)CONCAT44(extraout_var_01,iVar2) != (char *)0x0) {
        uVar3 = atoi((char *)CONCAT44(extraout_var_01,iVar2));
        mesh->mMaterialIndex = uVar3;
      }
    }
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
  }
  uVar4 = (long)local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  mesh->mNumFaces = (uint)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  puVar5 = (ulong *)operator_new__(uVar4 * 0x10 + 8);
  *puVar5 = uVar4;
  __result = (aiFace *)(puVar5 + 1);
  if (uVar4 != 0) {
    paVar6 = __result;
    do {
      paVar6->mNumIndices = 0;
      paVar6->mIndices = (uint *)0x0;
      paVar6 = paVar6 + 1;
    } while (paVar6 != __result + uVar4);
  }
  mesh->mFaces = __result;
  mesh->mPrimitiveTypes = 4;
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<aiFace*,aiFace*>
            (__first,__last,__result);
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_78);
  return;
}

Assistant:

void ImportTriangles(aiMesh* mesh) {
         std::vector<aiFace> faces;

         while(ReadToEndElement(D3MF::XmlTag::triangles)) {
             const std::string nodeName( xmlReader->getNodeName() );
             if(xmlReader->getNodeName() == D3MF::XmlTag::triangle) {
                 faces.push_back(ReadTriangle());
                 const char *pidToken( xmlReader->getAttributeValue( D3MF::XmlTag::p1.c_str() ) );
                 if ( nullptr != pidToken ) {
                     int matIdx( std::atoi( pidToken ) );
                     mesh->mMaterialIndex = matIdx;
                 }
             }
         }

        mesh->mNumFaces = static_cast<unsigned int>(faces.size());
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        std::copy(faces.begin(), faces.end(), mesh->mFaces);
    }